

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::IRContext::ReplaceAllUsesWithPredicate
          (IRContext *this,uint32_t before,uint32_t after,
          function<bool_(spvtools::opt::Instruction_*)> *predicate)

{
  initializer_list<unsigned_int> init_list;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  DebugInfoManager *this_00;
  DefUseManager *pDVar4;
  Instruction *pIVar5;
  reference ppVar6;
  uint32_t local_124;
  iterator local_120;
  undefined8 local_118;
  SmallVector<unsigned_int,_2UL> local_110;
  uint32_t local_e4;
  undefined1 auStack_e0 [4];
  uint32_t in_operand_pos;
  size_t local_d8;
  size_t local_d0;
  spv_position_t local_c8;
  uint local_b0;
  uint local_ac;
  uint32_t type_result_id_count;
  uint32_t index;
  Instruction *user;
  pair<spvtools::opt::Instruction_*,_unsigned_int> p;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  *__range2;
  Instruction *prev;
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  *local_68;
  function<void_(spvtools::opt::Instruction_*,_unsigned_int)> local_60;
  undefined1 local_40 [8];
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  uses_to_update;
  function<bool_(spvtools::opt::Instruction_*)> *predicate_local;
  uint32_t after_local;
  uint32_t before_local;
  IRContext *this_local;
  
  if (before == after) {
    this_local._7_1_ = false;
  }
  else {
    uses_to_update.
    super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)predicate;
    bVar1 = AreAnalysesValid(this,kAnalysisDebugInfo);
    if (bVar1) {
      this_00 = get_debug_info_mgr(this);
      analysis::DebugInfoManager::ReplaceAllUsesInDebugScopeWithPredicate
                (this_00,before,after,
                 (function<bool_(spvtools::opt::Instruction_*)> *)
                 uses_to_update.
                 super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    pDVar4 = get_def_use_mgr(this);
    pIVar5 = analysis::DefUseManager::GetDef(pDVar4,after);
    if (pIVar5 == (Instruction *)0x0) {
      __assert_fail("get_def_use_mgr()->GetDef(after) && \"\'after\' is not a registered def.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp"
                    ,0x148,
                    "bool spvtools::opt::IRContext::ReplaceAllUsesWithPredicate(uint32_t, uint32_t, const std::function<bool (Instruction *)> &)"
                   );
    }
    std::
    vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
    ::vector((vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
              *)local_40);
    pDVar4 = get_def_use_mgr(this);
    prev = (Instruction *)
           uses_to_update.
           super__Vector_base<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68 = (vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                *)local_40;
    std::function<void(spvtools::opt::Instruction*,unsigned_int)>::
    function<spvtools::opt::IRContext::ReplaceAllUsesWithPredicate(unsigned_int,unsigned_int,std::function<bool(spvtools::opt::Instruction*)>const&)::__0,void>
              ((function<void(spvtools::opt::Instruction*,unsigned_int)> *)&local_60,
               (anon_class_16_2_b983b9fa *)&prev);
    analysis::DefUseManager::ForEachUse(pDVar4,before,&local_60);
    std::function<void_(spvtools::opt::Instruction_*,_unsigned_int)>::~function(&local_60);
    __range2 = (vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                *)0x0;
    __end2 = std::
             vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
             ::begin((vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                      *)local_40);
    p._8_8_ = std::
              vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
              ::end((vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                     *)local_40);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>_>
                                       *)&p.second), bVar1) {
      ppVar6 = __gnu_cxx::
               __normal_iterator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>_>
               ::operator*(&__end2);
      _type_result_id_count = ppVar6->first;
      p.first = *(Instruction **)&ppVar6->second;
      local_ac = (uint)p.first;
      user = _type_result_id_count;
      if ((__range2 ==
           (vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
            *)0x0) || ((Instruction *)__range2 != _type_result_id_count)) {
        ForgetUses(this,_type_result_id_count);
        __range2 = (vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
                    *)_type_result_id_count;
      }
      uVar2 = opt::Instruction::result_id(_type_result_id_count);
      uVar3 = opt::Instruction::type_id(_type_result_id_count);
      pIVar5 = _type_result_id_count;
      local_b0 = (uint)(uVar2 != 0) + (uint)(uVar3 != 0);
      if (local_ac < local_b0) {
        uVar2 = opt::Instruction::type_id(_type_result_id_count);
        if ((uVar2 == 0) || (local_ac != 0)) {
          uVar2 = opt::Instruction::type_id(_type_result_id_count);
          if (uVar2 == 0) {
            local_c8.line = 0x165;
            local_c8.column = 0;
            local_c8.index = 0;
            Log(&this->consumer_,SPV_MSG_INTERNAL_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp"
                ,&local_c8,
                "assertion failed: Result type id considered as use while the instruction doesn\'t have a result type id."
               );
            exit(1);
          }
          _auStack_e0 = 0x169;
          local_d8 = 0;
          local_d0 = 0;
          Log(&this->consumer_,SPV_MSG_INTERNAL_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp"
              ,(spv_position_t *)auStack_e0,
              "assertion failed: Trying setting the immutable result id.");
          exit(1);
        }
        opt::Instruction::SetResultType(_type_result_id_count,after);
      }
      else {
        uVar2 = local_ac - local_b0;
        local_120 = &local_124;
        local_118 = 1;
        init_list._M_len = 1;
        init_list._M_array = local_120;
        local_124 = after;
        local_e4 = uVar2;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_110,init_list);
        opt::Instruction::SetInOperand(pIVar5,uVar2,&local_110);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_110);
      }
      AnalyzeUses(this,_type_result_id_count);
      __gnu_cxx::
      __normal_iterator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_*,_std::vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>_>
      ::operator++(&__end2);
    }
    this_local._7_1_ = true;
    std::
    vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
    ::~vector((vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
               *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool IRContext::ReplaceAllUsesWithPredicate(
    uint32_t before, uint32_t after,
    const std::function<bool(Instruction*)>& predicate) {
  if (before == after) return false;

  if (AreAnalysesValid(kAnalysisDebugInfo)) {
    get_debug_info_mgr()->ReplaceAllUsesInDebugScopeWithPredicate(before, after,
                                                                  predicate);
  }

  // Ensure that |after| has been registered as def.
  assert(get_def_use_mgr()->GetDef(after) &&
         "'after' is not a registered def.");

  std::vector<std::pair<Instruction*, uint32_t>> uses_to_update;
  get_def_use_mgr()->ForEachUse(
      before, [&predicate, &uses_to_update](Instruction* user, uint32_t index) {
        if (predicate(user)) {
          uses_to_update.emplace_back(user, index);
        }
      });

  Instruction* prev = nullptr;
  for (auto p : uses_to_update) {
    Instruction* user = p.first;
    uint32_t index = p.second;
    if (prev == nullptr || prev != user) {
      ForgetUses(user);
      prev = user;
    }
    const uint32_t type_result_id_count =
        (user->result_id() != 0) + (user->type_id() != 0);

    if (index < type_result_id_count) {
      // Update the type_id. Note that result id is immutable so it should
      // never be updated.
      if (user->type_id() != 0 && index == 0) {
        user->SetResultType(after);
      } else if (user->type_id() == 0) {
        SPIRV_ASSERT(consumer_, false,
                     "Result type id considered as use while the instruction "
                     "doesn't have a result type id.");
        (void)consumer_;  // Makes the compiler happy for release build.
      } else {
        SPIRV_ASSERT(consumer_, false,
                     "Trying setting the immutable result id.");
      }
    } else {
      // Update an in-operand.
      uint32_t in_operand_pos = index - type_result_id_count;
      // Make the modification in the instruction.
      user->SetInOperand(in_operand_pos, {after});
    }
    AnalyzeUses(user);
  }
  return true;
}